

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2.cpp
# Opt level: O3

void buildHLD(int v,int c)

{
  pointer piVar1;
  int c_00;
  ulong uVar2;
  
  top.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[v] = c;
  piVar1 = G.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[v].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (G.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[v].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish != piVar1) {
    uVar2 = 0;
    do {
      c_00 = piVar1[uVar2];
      if (uVar2 == 0) {
        c_00 = c;
      }
      buildHLD(piVar1[uVar2],c_00);
      uVar2 = uVar2 + 1;
      piVar1 = G.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[v].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar2 < (ulong)((long)G.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[v].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  return;
}

Assistant:

void buildHLD(int v = 0, int c = 0) {
	top[v] = c;
	rep(i, 0, G[v].size())
		buildHLD(G[v][i], (i) ? G[v][i] : c);
}